

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_ps.c
# Opt level: O2

MPP_RET h265e_set_pps(H265eCtx *ctx,H265ePps *pps,H265eSps *sps)

{
  RK_U32 RVar1;
  RK_S32 RVar2;
  MppEncCfgSet *pMVar3;
  RockchipSocType RVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  undefined8 uVar12;
  
  pMVar3 = ctx->cfg;
  pps->m_bConstrainedIntraPred = (pMVar3->codec).field_1.h264.log2_max_frame_num;
  pps->m_PPSId = 0;
  pps->m_SPSId = 0;
  pps->m_useDQP = 1;
  RVar1 = (pMVar3->codec).field_1.h265.trans_cfg.diff_cu_qp_delta_depth;
  pps->m_maxCuDQPDepth = RVar1;
  pps->m_minCuDQPSize = sps->m_maxCUSize >> ((byte)RVar1 & 0x1f);
  pps->m_sps = sps;
  pps->m_bSliceChromaQpFlag = 0;
  RVar2 = (pMVar3->codec).field_1.h265.trans_cfg.cb_qp_offset;
  pps->m_chromaCbQpOffset = RVar2;
  pps->m_chromaCrQpOffset = RVar2;
  pps->m_bUseWeightPred = 0;
  pps->m_useWeightedBiPred = 0;
  pps->m_outputFlagPresentFlag = 0;
  pps->m_picInitQPMinus26 = (pMVar3->codec).field_1.h264.chroma_cb_qp_offset + -0x1a;
  pps->m_LFCrossSliceBoundaryFlag = (pMVar3->codec).field_1.h265.lpf_acs_sli_en;
  bVar11 = (pMVar3->codec).field_1.h265.dblk_cfg.slice_deblocking_filter_disabled_flag == 0;
  pps->m_deblockingFilterControlPresentFlag = (uint)bVar11;
  if (bVar11) {
    uVar12 = *(undefined8 *)((long)&(pMVar3->codec).field_1 + 0xf4);
  }
  else {
    uVar12 = 0;
  }
  pps->m_deblockingFilterOverrideEnabledFlag = 0;
  pps->m_picDisableDeblockingFilterFlag = (uint)!bVar11;
  pps->m_deblockingFilterBetaOffsetDiv2 = (int)uVar12;
  pps->m_deblockingFilterTcOffsetDiv2 = (int)((ulong)uVar12 >> 0x20);
  pps->m_listsModificationPresentFlag = 1;
  pps->m_log2ParallelMergeLevelMinus2 = 0;
  pps->m_numRefIdxL0DefaultActive = 1;
  pps->m_numRefIdxL1DefaultActive = 1;
  uVar12 = *(undefined8 *)((long)&(pMVar3->codec).field_1 + 0xcc);
  pps->m_transquantBypassEnableFlag = (int)uVar12;
  pps->m_useTransformSkip = (int)((ulong)uVar12 >> 0x20);
  pps->m_cabacInitPresentFlag = (pMVar3->codec).field_1.h265.entropy_cfg.cabac_init_flag;
  pps->m_encCABACTableIdx = 2;
  pps->m_sliceHeaderExtensionPresentFlag = 0;
  pps->m_numExtraSliceHeaderBits = 0;
  pps->m_entropyCodingSyncEnabledFlag = 0;
  pps->m_signHideFlag = 0;
  pps->m_tiles_enabled_flag = 0;
  pps->m_bTileUniformSpacing = 0;
  pps->m_nNumTileRowsMinus1 = 0;
  pps->m_nNumTileColumnsMinus1 = 0;
  pps->m_loopFilterAcrossTilesEnabledFlag =
       (uint)((pMVar3->codec).field_1.h265.lpf_acs_tile_disable == 0);
  RVar4 = mpp_get_soc_type();
  uVar5 = sps->m_picWidthInLumaSamples;
  uVar7 = sps->m_maxCUSize;
  uVar6 = ((uVar5 + uVar7) - 1) / uVar7;
  uVar7 = ((uVar7 + sps->m_picHeightInLumaSamples) - 1) / uVar7;
  if (RVar4 == ROCKCHIP_SOC_RK3566) {
LAB_001c86b8:
    uVar5 = (uVar5 - 1) / 0x780;
    pps->m_nNumTileColumnsMinus1 = uVar5;
  }
  else {
    if (RVar4 == ROCKCHIP_SOC_RK3588) {
      if (uVar5 < 0x2001) {
        if (uVar5 < 0x1001) {
          uVar5 = (uint)((pMVar3->codec).field_1.h265.auto_tile != 0);
          pps->m_nNumTileColumnsMinus1 = uVar5;
          goto LAB_001c86dd;
        }
        uVar5 = 1;
      }
      else {
        uVar5 = 3;
      }
      pps->m_nNumTileColumnsMinus1 = uVar5;
      goto LAB_001c86f8;
    }
    if (RVar4 == ROCKCHIP_SOC_RK3568) goto LAB_001c86b8;
    uVar5 = pps->m_nNumTileColumnsMinus1;
  }
LAB_001c86dd:
  if (uVar5 == 0) {
    return MPP_OK;
  }
LAB_001c86f8:
  pps->m_tiles_enabled_flag = 1;
  pps->m_bTileUniformSpacing = 1;
  pps->m_loopFilterAcrossTilesEnabledFlag =
       (uint)((pMVar3->codec).field_1.h265.lpf_acs_tile_disable == 0);
  iVar9 = uVar5 + 1;
  uVar10 = 0;
  uVar8 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar8 = uVar10;
  }
  while (uVar8 != uVar10) {
    pps->m_nTileColumnWidthArray[uVar10] =
         (int)(uVar6 * (int)(uVar10 + 1)) / iVar9 - (int)((int)uVar10 * uVar6) / iVar9;
    pps->m_nTileRowHeightArray[uVar10] = uVar7;
    uVar10 = uVar10 + 1;
  }
  pps->m_nTileColumnWidthArray[uVar8] = uVar6 - (int)((int)uVar8 * uVar6) / iVar9;
  pps->m_nTileRowHeightArray[uVar8] = uVar7;
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_pps(H265eCtx  *ctx, H265ePps *pps, H265eSps *sps)
{
    MppEncH265Cfg *codec = &ctx->cfg->codec.h265;

    pps->m_bConstrainedIntraPred = codec->const_intra_pred;
    pps->m_PPSId = 0;
    pps->m_SPSId = 0;
    pps->m_picInitQPMinus26 = 0;
    pps->m_useDQP = 1;
    pps->m_maxCuDQPDepth = codec->trans_cfg.diff_cu_qp_delta_depth;
    pps->m_minCuDQPSize = (sps->m_maxCUSize >> pps->m_maxCuDQPDepth);

    pps->m_sps = sps;
    pps->m_bSliceChromaQpFlag = 0;
    pps->m_chromaCbQpOffset = codec->trans_cfg.cb_qp_offset;
    /* rkvenc hw only support one color qp offset. Set all offset to cb offset*/
    pps->m_chromaCrQpOffset = codec->trans_cfg.cb_qp_offset;

    pps->m_entropyCodingSyncEnabledFlag = 0;
    pps->m_bUseWeightPred = 0;
    pps->m_useWeightedBiPred = 0;
    pps->m_outputFlagPresentFlag = 0;
    pps->m_signHideFlag = 0;
    pps->m_picInitQPMinus26 = codec->intra_qp - 26;
    pps->m_LFCrossSliceBoundaryFlag = codec->lpf_acs_sli_en;
    pps->m_deblockingFilterControlPresentFlag = !codec->dblk_cfg.slice_deblocking_filter_disabled_flag;
    if (pps->m_deblockingFilterControlPresentFlag) {
        pps->m_deblockingFilterOverrideEnabledFlag = 0;
        pps->m_picDisableDeblockingFilterFlag = 0;
        if (!pps->m_picDisableDeblockingFilterFlag) {
            pps->m_deblockingFilterBetaOffsetDiv2 = codec->dblk_cfg.slice_beta_offset_div2;
            pps->m_deblockingFilterTcOffsetDiv2 = codec->dblk_cfg.slice_tc_offset_div2;
        }
    } else {
        pps->m_deblockingFilterOverrideEnabledFlag = 0;
        pps->m_picDisableDeblockingFilterFlag = 1;
        pps->m_deblockingFilterBetaOffsetDiv2 = 0;
        pps->m_deblockingFilterTcOffsetDiv2 = 0;
    }

    pps->m_listsModificationPresentFlag = 1;
    pps->m_log2ParallelMergeLevelMinus2 = 0;
    pps->m_numRefIdxL0DefaultActive = 1;
    pps->m_numRefIdxL1DefaultActive = 1;
    pps->m_transquantBypassEnableFlag = codec->trans_cfg.transquant_bypass_enabled_flag;
    pps->m_useTransformSkip = codec->trans_cfg.transform_skip_enabled_flag;

    pps->m_entropyCodingSyncEnabledFlag = 0;
    pps->m_signHideFlag = 0;
    pps->m_cabacInitPresentFlag = codec->entropy_cfg.cabac_init_flag;
    pps->m_encCABACTableIdx = I_SLICE;
    pps->m_sliceHeaderExtensionPresentFlag = 0;
    pps->m_numExtraSliceHeaderBits = 0;
    pps->m_tiles_enabled_flag = 0;
    pps->m_bTileUniformSpacing = 0;
    pps->m_nNumTileRowsMinus1 = 0;
    pps->m_nNumTileColumnsMinus1 = 0;
    pps->m_loopFilterAcrossTilesEnabledFlag = !codec->lpf_acs_tile_disable;
    {
        RockchipSocType soc_type = mpp_get_soc_type();
        RK_S32 index;
        RK_S32 mb_w = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        RK_S32 mb_h = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        RK_S32 tile_width;

        /* check tile support on rk3566 and rk3568 */
        if (soc_type == ROCKCHIP_SOC_RK3566 || soc_type == ROCKCHIP_SOC_RK3568) {
            pps->m_nNumTileColumnsMinus1 = (sps->m_picWidthInLumaSamples - 1) / 1920 ;
        } else if (soc_type == ROCKCHIP_SOC_RK3588) {
            if (sps->m_picWidthInLumaSamples > 8192) {
                /* 4 tile for over 8k encoding */
                pps->m_nNumTileColumnsMinus1 = 3;
            } else if (sps->m_picWidthInLumaSamples > 4096) {
                /* 2 tile for 4k ~ 8k encoding */
                pps->m_nNumTileColumnsMinus1 = 1;
            } else {
                /* 1 tile for less 4k encoding and use 2 tile on auto tile enabled */
                pps->m_nNumTileColumnsMinus1 = codec->auto_tile ? 1 : 0;
            }
        }
        if (pps->m_nNumTileColumnsMinus1) {
            pps->m_tiles_enabled_flag = 1;
            pps->m_bTileUniformSpacing = 1;
            pps->m_loopFilterAcrossTilesEnabledFlag = !codec->lpf_acs_tile_disable;

            /* calc width per tile */
            for (index = 0; index < pps->m_nNumTileColumnsMinus1; index++) {
                tile_width = (index + 1) * mb_w / (pps->m_nNumTileColumnsMinus1 + 1) -
                             index * mb_w / (pps->m_nNumTileColumnsMinus1 + 1);
                pps->m_nTileColumnWidthArray[index] = tile_width;
                pps->m_nTileRowHeightArray[index] = mb_h;
            }
            tile_width = mb_w - index * mb_w / (pps->m_nNumTileColumnsMinus1 + 1);
            pps->m_nTileColumnWidthArray[index] = tile_width;
            pps->m_nTileRowHeightArray[index] = mb_h;
        }
    }

    return 0;
}